

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

ssize_t __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::send
          (RpcServerResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar1;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar2;
  long *plVar3;
  int *piVar4;
  RemoveConst<int> *pRVar5;
  int *piVar6;
  uint *puVar7;
  size_t sVar8;
  long lVar9;
  undefined4 in_register_00000034;
  long lVar10;
  ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> capTable;
  Vector<int> fds;
  Vector<int> local_88;
  Array<unsigned_int> local_68;
  int *local_48;
  long lStack_40;
  ArrayDisposer *local_38;
  Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&> local_30;
  
  lVar10 = CONCAT44(in_register_00000034,__fd);
  pMVar1 = *(Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> **)(lVar10 + 0x28);
  pMVar2 = *(Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> **)(lVar10 + 0x30);
  capTable.size_ = (long)pMVar2 - (long)pMVar1 >> 4;
  local_88.builder.ptr = (int *)0x0;
  local_88.builder.pos = (RemoveConst<int> *)0x0;
  local_88.builder.endPtr = (RemoveConst<int> *)0x0;
  local_88.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  local_30.ptr = (HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)
                 (lVar10 + 0x70);
  capTable.ptr = pMVar1;
  writeDescriptors(&local_68,*(RpcConnectionState **)(lVar10 + 8),capTable,
                   (Builder)*(StructBuilder *)(lVar10 + 0x48),&local_88,&local_30);
  plVar3 = *(long **)(lVar10 + 0x18);
  if (local_88.builder.pos != local_88.builder.endPtr) {
    kj::Vector<int>::setCapacity
              (&local_88,(long)local_88.builder.pos - (long)local_88.builder.ptr >> 2);
  }
  lStack_40 = (long)local_88.builder.pos - (long)local_88.builder.ptr >> 2;
  local_48 = local_88.builder.ptr;
  local_38 = local_88.builder.disposer;
  local_88.builder.ptr = (int *)0x0;
  local_88.builder.pos = (RemoveConst<int> *)0x0;
  local_88.builder.endPtr = (int *)0x0;
  (**(code **)(*plVar3 + 8))(plVar3,&local_48);
  lVar9 = lStack_40;
  piVar4 = local_48;
  if (local_48 != (int *)0x0) {
    local_48 = (int *)0x0;
    lStack_40 = 0;
    (**local_38->_vptr_ArrayDisposer)(local_38,piVar4,4,lVar9,lVar9,0);
  }
  (**(code **)(**(long **)(lVar10 + 0x18) + 0x10))();
  sVar8 = local_68.size_;
  puVar7 = local_68.ptr;
  if (pMVar2 == pMVar1) {
    *(undefined1 *)&(this->super_RpcServerResponse)._vptr_RpcServerResponse = 0;
    if ((RpcConnectionState *)local_68.ptr != (RpcConnectionState *)0x0) {
      local_68.ptr = (uint *)0x0;
      local_68.size_ = 0;
      (**(local_68.disposer)->_vptr_ArrayDisposer)(local_68.disposer,puVar7,4,sVar8,sVar8,0);
    }
  }
  else {
    this->connectionState = (RpcConnectionState *)local_68.ptr;
    (this->message).disposer = (Disposer *)local_68.size_;
    (this->message).ptr = (OutgoingRpcMessage *)local_68.disposer;
    *(undefined1 *)&(this->super_RpcServerResponse)._vptr_RpcServerResponse = 1;
  }
  piVar6 = local_88.builder.endPtr;
  pRVar5 = local_88.builder.pos;
  piVar4 = local_88.builder.ptr;
  if (local_88.builder.ptr != (int *)0x0) {
    local_88.builder.ptr = (int *)0x0;
    local_88.builder.pos = (RemoveConst<int> *)0x0;
    local_88.builder.endPtr = (int *)0x0;
    (**(local_88.builder.disposer)->_vptr_ArrayDisposer)
              (local_88.builder.disposer,piVar4,4,(long)pRVar5 - (long)piVar4 >> 2,
               (long)piVar6 - (long)piVar4 >> 2,0);
  }
  return (ssize_t)this;
}

Assistant:

kj::Maybe<kj::Array<ExportId>> send() {
      // Send the response and return the export list.  Returns kj::none if there were no caps.
      // (Could return a non-null empty array if there were caps but none of them were exports.)

      // Build the cap table.
      auto capTable = this->capTable.getTable();
      kj::Vector<int> fds;
      auto exports = connectionState.writeDescriptors(
          capTable, payload, fds, resolutionsAtReturnTime);
      message->setFds(fds.releaseAsArray());

      message->send();
      if (capTable.size() == 0) {
        return kj::none;
      } else {
        return kj::mv(exports);
      }
    }